

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

char * Scl_LibertyReadPinFormula(Scl_Tree_t *p,Scl_Item_t *pPin)

{
  int iVar1;
  Scl_Item_t *pSVar2;
  char *pcVar3;
  int *piVar4;
  
  piVar4 = &pPin->Child;
  while( true ) {
    pSVar2 = Scl_LibertyItem(p,*piVar4);
    if (pSVar2 == (Scl_Item_t *)0x0) {
      return (char *)0x0;
    }
    iVar1 = Scl_LibertyCompare(p,pSVar2->Key,"function");
    if (iVar1 == 0) break;
    piVar4 = &pSVar2->Next;
  }
  pcVar3 = Scl_LibertyReadString(p,pSVar2->Head);
  return pcVar3;
}

Assistant:

char * Scl_LibertyReadPinFormula( Scl_Tree_t * p, Scl_Item_t * pPin )
{
    Scl_Item_t * pFunc;
    Scl_ItemForEachChildName( p, pPin, pFunc, "function" )
        return Scl_LibertyReadString(p, pFunc->Head);
    return NULL;
}